

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O0

void test3(void)

{
  GarbageCollectedBase *pGVar1;
  ostream *this;
  void *local_28;
  LinkedNode *local_20;
  LinkedNode *t;
  HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHStack_10;
  int id;
  HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *p;
  
  pHStack_10 = TinyGC::
               MakeGarbageCollected<HeapMap<int,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                         (tg);
  for (t._4_4_ = 0; t._4_4_ < 10; t._4_4_ = t._4_4_ + 1) {
    local_28 = (void *)0x0;
    local_20 = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>
                         (tg,&local_28,(int *)((long)&t + 4));
    HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(pHStack_10,(int *)((long)&t + 4),local_20);
    pGVar1 = HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
             ::at(pHStack_10,(int *)((long)&t + 4));
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pGVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void test3() {
  HeapMap<int, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<int, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(id, t);
    // p->erase(id);
    std::cout << p->at(id) << std::endl;
  }
}